

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * multOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  NumberDescriptor *this;
  StringDescriptor *this_00;
  ostream *poVar1;
  int i;
  int iVar2;
  double dVar3;
  string finalValue;
  double local_50;
  string stringValue;
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type == STRING) {
      poVar1 = std::operator<<((ostream *)&std::cout,"TypeDescriptor *multOperator: ");
      std::__cxx11::string::string((string *)&stringValue,(string *)&leftValue->_string);
      poVar1 = std::operator<<(poVar1,(string *)&stringValue);
      poVar1 = std::operator<<(poVar1," * ");
      std::__cxx11::string::string((string *)&finalValue,(string *)&rightValue->_string);
      poVar1 = std::operator<<(poVar1,(string *)&finalValue);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&finalValue);
      std::__cxx11::string::~string((string *)&stringValue);
      poVar1 = std::operator<<((ostream *)&std::cout,"Cannot multiply:");
      std::__cxx11::string::string((string *)&stringValue,(string *)&leftValue->_string);
      poVar1 = std::operator<<(poVar1,(string *)&stringValue);
      poVar1 = std::operator<<(poVar1," * ");
      std::__cxx11::string::string((string *)&finalValue,(string *)&rightValue->_string);
      poVar1 = std::operator<<(poVar1,(string *)&finalValue);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&finalValue);
      std::__cxx11::string::~string((string *)&stringValue);
      goto LAB_0010e271;
    }
  }
  else if ((leftValue->_type == NUMBER) && (rightValue->_type == NUMBER)) {
    this = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor(this,leftValue->_number * rightValue->_number);
    return &this->super_TypeDescriptor;
  }
  dVar3 = fmod(leftValue->_number,1.0);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar3 = fmod(rightValue->_number,1.0);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_0010e271:
      exit(2);
    }
  }
  stringValue._M_dataplus._M_p = (pointer)&stringValue.field_2;
  stringValue._M_string_length = 0;
  stringValue.field_2._M_local_buf[0] = '\0';
  if (leftValue->_type == NUMBER) {
    local_50 = leftValue->_number;
    std::__cxx11::string::string((string *)&finalValue,(string *)&rightValue->_string);
  }
  else {
    local_50 = rightValue->_number;
    std::__cxx11::string::string((string *)&finalValue,(string *)&leftValue->_string);
  }
  std::__cxx11::string::operator=((string *)&stringValue,(string *)&finalValue);
  std::__cxx11::string::~string((string *)&finalValue);
  finalValue._M_dataplus._M_p = (pointer)&finalValue.field_2;
  finalValue._M_string_length = 0;
  finalValue.field_2._M_local_buf[0] = '\0';
  for (iVar2 = 0; (double)iVar2 < local_50; iVar2 = iVar2 + 1) {
    std::__cxx11::string::append((string *)&finalValue);
  }
  this_00 = (StringDescriptor *)operator_new(0x78);
  StringDescriptor::StringDescriptor(this_00,&finalValue);
  std::__cxx11::string::~string((string *)&finalValue);
  std::__cxx11::string::~string((string *)&stringValue);
  return &this_00->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *multOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numProduct = new  NumberDescriptor(leftValue->getNumber() * rightValue->getNumber());
        //std::cout << "TypeDescriptor *multOperator: " << leftValue->getNumber() << " * " << rightValue->getNumber() << std::endl;
        return numProduct;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING){
        std::cout << "TypeDescriptor *multOperator: " << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        std::cout << "Cannot multiply:" << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        if(std::fmod(leftValue->getNumber(),1) == 0
        ||std::fmod(rightValue->getNumber(),1) == 0){
            double range = 0;
            std::string stringValue;
            if(leftValue->type() == TypeDescriptor::NUMBER){
                range = leftValue->getNumber();
                stringValue = rightValue->getString();
            }
            else{
                range = rightValue->getNumber();
                stringValue = leftValue->getString();
            }
            std::string finalValue;
            for(int i = 0; i < range; i++){
                finalValue += stringValue;
            }
            auto *stringProduct = new StringDescriptor(finalValue);
            return stringProduct;
        }
        else{
            std::cout << "Unknown type. Terminating..." << std::endl;
            exit(2);
        }
    }
}